

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

string * __thiscall
tinyusdz::Path::full_path_name_abi_cxx11_(string *__return_storage_ptr__,Path *this)

{
  ulong uVar1;
  string local_40 [39];
  undefined1 local_19;
  Path *local_18;
  Path *this_local;
  string *s;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Path *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((this->_valid & 1U) == 0) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"#INVALID#");
  }
  ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)this);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::operator+((char *)local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x63b15a);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_40);
    ::std::__cxx11::string::~string(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string full_path_name() const {
    std::string s;
    if (!_valid) {
      s += "#INVALID#";
    }

    s += _prim_part;
    if (_prop_part.empty()) {
      return s;
    }

    s += "." + _prop_part;

    return s;
  }